

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Vector3 ColorToHSV(Color color)

{
  uint6 uVar1;
  uint uVar2;
  uint uVar3;
  float fVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  float fVar11;
  undefined4 uVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar13;
  undefined4 in_XMM3_Db;
  float fVar14;
  Vector3 VVar15;
  Vector3 VVar16;
  Vector3 VVar17;
  undefined1 auVar4 [16];
  
  fVar13 = (float)((uint)color >> 0x10 & 0xff) / 255.0;
  uVar1 = CONCAT24(color._0_2_,(uint)color >> 8) & 0xff000000ff;
  auVar9._0_4_ = (float)(int)uVar1;
  auVar9._4_4_ = (float)(ushort)(uVar1 >> 0x20);
  auVar9._8_8_ = 0;
  auVar9 = divps(auVar9,_DAT_0015d8c0);
  fVar8 = auVar9._0_4_;
  fVar11 = auVar9._4_4_;
  fVar14 = (float)(~-(uint)(fVar11 < fVar8) & (uint)fVar8 | (uint)fVar11 & -(uint)(fVar11 < fVar8));
  fVar7 = (float)(~-(uint)(fVar8 < fVar11) & (uint)fVar8 | (uint)fVar11 & -(uint)(fVar8 < fVar11));
  uVar2 = -(uint)(fVar14 < fVar13);
  uVar3 = -(uint)(fVar13 < fVar7);
  fVar7 = (float)(~uVar3 & (uint)fVar13 | (uint)fVar7 & uVar3);
  fVar14 = fVar7 - (float)(~uVar2 & (uint)fVar13 | (uint)fVar14 & uVar2);
  auVar4._0_8_ = 0;
  if (1e-05 <= fVar14) {
    if (fVar7 <= 0.0) {
      VVar16.z = fVar7;
      VVar16.x = NAN;
      VVar16.y = 0.0;
      return VVar16;
    }
    if (fVar7 <= fVar11) {
      auVar10._0_4_ = (fVar8 - fVar13) / fVar14;
      auVar10._4_12_ = auVar9._4_12_;
      auVar4._0_8_ = auVar10._0_8_;
    }
    else if (fVar7 <= fVar8) {
      auVar4._0_8_ = CONCAT44(in_XMM3_Db,(fVar13 - fVar11) / fVar14 + 2.0);
    }
    else {
      auVar4._0_8_ = CONCAT44(fVar11,(fVar11 - fVar8) / fVar14 + 4.0);
    }
    fVar8 = (float)auVar4._0_8_ * 60.0;
    uVar12 = (undefined4)((ulong)auVar4._0_8_ >> 0x20);
    auVar5._4_4_ = uVar12;
    auVar5._0_4_ = fVar8;
    auVar5._8_4_ = uVar12;
    auVar5._12_4_ = fVar7;
    auVar4._8_8_ = auVar5._8_8_;
    auVar4._0_8_ = CONCAT44(fVar14 / fVar7,fVar8);
    if (fVar8 < 0.0) {
      auVar6._4_12_ = auVar4._4_12_;
      auVar6._0_4_ = fVar8 + 360.0;
      VVar17._0_8_ = auVar6._0_8_;
      VVar17.z = fVar7;
      return VVar17;
    }
  }
  VVar15.z = fVar7;
  VVar15.x = (float)(int)auVar4._0_8_;
  VVar15.y = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
  return VVar15;
}

Assistant:

Vector3 ColorToHSV(Color color)
{
    Vector3 hsv = { 0 };
    Vector3 rgb = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
    float min, max, delta;

    min = rgb.x < rgb.y? rgb.x : rgb.y;
    min = min  < rgb.z? min  : rgb.z;

    max = rgb.x > rgb.y? rgb.x : rgb.y;
    max = max  > rgb.z? max  : rgb.z;

    hsv.z = max;            // Value
    delta = max - min;

    if (delta < 0.00001f)
    {
        hsv.y = 0.0f;
        hsv.x = 0.0f;       // Undefined, maybe NAN?
        return hsv;
    }

    if (max > 0.0f)
    {
        // NOTE: If max is 0, this divide would cause a crash
        hsv.y = (delta/max);    // Saturation
    }
    else
    {
        // NOTE: If max is 0, then r = g = b = 0, s = 0, h is undefined
        hsv.y = 0.0f;
        hsv.x = NAN;        // Undefined
        return hsv;
    }

    // NOTE: Comparing float values could not work properly
    if (rgb.x >= max) hsv.x = (rgb.y - rgb.z)/delta;    // Between yellow & magenta
    else
    {
        if (rgb.y >= max) hsv.x = 2.0f + (rgb.z - rgb.x)/delta;  // Between cyan & yellow
        else hsv.x = 4.0f + (rgb.x - rgb.y)/delta;      // Between magenta & cyan
    }

    hsv.x *= 60.0f;     // Convert to degrees

    if (hsv.x < 0.0f) hsv.x += 360.0f;

    return hsv;
}